

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall TextEntry::on_key_down(TextEntry *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  long in_RSI;
  long *in_RDI;
  TextEntry *in_stack_00000010;
  
  uVar3 = (**(code **)(*in_RDI + 0x80))();
  if ((uVar3 & 1) == 0) {
    switch(*(undefined4 *)(in_RSI + 0x20)) {
    case 0x3f:
      uVar3 = al_ustr_prev(in_RDI[7],(long)in_RDI + 0x44);
      if ((uVar3 & 1) != 0) {
        al_ustr_remove_chr(in_RDI[7],*(undefined4 *)((long)in_RDI + 0x44));
      }
      break;
    default:
      if (0x1f < *(int *)(in_RSI + 0x24)) {
        al_ustr_insert_chr(in_RDI[7],*(undefined4 *)((long)in_RDI + 0x44),
                           *(undefined4 *)(in_RSI + 0x24));
        iVar2 = al_utf8_width(*(undefined4 *)(in_RSI + 0x24));
        *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0x44) + iVar2;
      }
      break;
    case 0x4d:
      al_ustr_remove_chr(in_RDI[7],*(undefined4 *)((long)in_RDI + 0x44));
      break;
    case 0x4e:
      *(undefined4 *)((long)in_RDI + 0x44) = 0;
      break;
    case 0x4f:
      uVar1 = al_ustr_size(in_RDI[7]);
      *(undefined4 *)((long)in_RDI + 0x44) = uVar1;
      break;
    case 0x52:
      al_ustr_prev(in_RDI[7],(long)in_RDI + 0x44);
      break;
    case 0x53:
      al_ustr_next(in_RDI[7],(long)in_RDI + 0x44);
    }
    maybe_scroll(in_stack_00000010);
    Dialog::request_draw((Dialog *)in_RDI[3]);
  }
  return;
}

Assistant:

void TextEntry::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (is_disabled())
      return;

   switch (event.keycode) {
      case ALLEGRO_KEY_LEFT:
         al_ustr_prev(text, &cursor_pos);
         break;

      case ALLEGRO_KEY_RIGHT:
         al_ustr_next(text, &cursor_pos);
         break;

      case ALLEGRO_KEY_HOME:
         cursor_pos = 0;
         break;

      case ALLEGRO_KEY_END:
         cursor_pos = al_ustr_size(text);
         break;

      case ALLEGRO_KEY_DELETE:
         al_ustr_remove_chr(text, cursor_pos);
         break;

      case ALLEGRO_KEY_BACKSPACE:
         if (al_ustr_prev(text, &cursor_pos))
            al_ustr_remove_chr(text, cursor_pos);
         break;

      default:
         if (event.unichar >= ' ') {
            al_ustr_insert_chr(text, cursor_pos, event.unichar);
            cursor_pos += al_utf8_width(event.unichar);
         }
         break;
   }

   maybe_scroll();
   dialog->request_draw();
}